

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseMessage.h
# Opt level: O1

void __thiscall
SGParser::Generator::ParseMessage::SetParseMessage
          (ParseMessage *this,Type type,String *name,String *message,uint id,size_t line,
          size_t offset,String *fileName,uint flags)

{
  this->Flags = flags & 0xfffffff0 | type;
  std::__cxx11::string::_M_assign((string *)&this->Name);
  std::__cxx11::string::_M_assign((string *)&this->Message);
  this->Id = id;
  this->Line = line;
  this->Offset = offset;
  std::__cxx11::string::_M_assign((string *)&this->FileName);
  return;
}

Assistant:

void SetParseMessage(Type type, const String& name, const String& message,
                         unsigned id = 0u, size_t line = NoValue, size_t offset = NoValue,
                         const String& fileName = String{}, unsigned flags = 0u) {
        Flags    = type | (flags & ~TypeMask);
        Name     = name;
        Message  = message;
        Id       = id;
        Line     = line;
        Offset   = offset;
        FileName = fileName;
    }